

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

StartLayout valid_layout_start(Env *env,Lexed next)

{
  bool bVar1;
  Symbol i;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lStack_8;
  
  for (lVar3 = 2; lVar3 != 9; lVar3 = lVar3 + 1) {
    if (env->symbols[lVar3] != false) goto LAB_00109a1e;
  }
  lVar3 = 0;
LAB_00109a1e:
  uVar4 = 0x900000000;
  uVar2 = (uint)lVar3;
  if (uVar2 == 0 || (env->state->contexts).size == 0) goto LAB_00109a9d;
  lStack_8 = 0;
  switch(uVar2) {
  case 3:
    lStack_8 = 1;
    break;
  case 4:
    lStack_8 = 2;
    break;
  case 5:
    lStack_8 = 5;
    bVar1 = true;
    goto LAB_00109a75;
  case 6:
    lStack_8 = 3;
    break;
  case 7:
    lStack_8 = 4;
  }
  bVar1 = false;
LAB_00109a75:
  if (next != LBar) {
    if (next == LBraceOpen) {
      if ((env->state->newline).state - NInit < 2) goto LAB_00109a9d;
      lStack_8 = 6;
      uVar2 = 8;
    }
    else if (bVar1) goto LAB_00109a9d;
  }
  uVar4 = lStack_8 << 0x20;
LAB_00109a9d:
  return (StartLayout)(uVar2 | uVar4);
}

Assistant:

static StartLayout valid_layout_start(Env *env, Lexed next) {
  StartLayout start = {.sym = valid_layout_start_sym(env), .sort = NoContext};
  if (uninitialized(env) || start.sym == FAIL) return start;
  ContextSort sort = layout_sort(start.sym);
  switch (next) {
    case LBar:
      break;
    case LBraceOpen:
      if (newline_active(env)) return start;
      sort = Braces;
      start.sym = START_EXPLICIT;
      break;
    default:
      if (sort == MultiWayIfLayout) return start;
      break;
  }
  start.sort = sort;
  return start;
}